

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O1

uint64_t roaring64_bitmap_rank(roaring64_bitmap_t *r,uint64_t val)

{
  ushort uVar1;
  bool bVar2;
  art_val_t *paVar3;
  art_key_chunk_t aVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint64_t uVar9;
  uint16_t x;
  uint uVar10;
  uint uVar11;
  run_container_t *prVar12;
  uint64_t unaff_R13;
  leaf_t *leaf;
  uint8_t high48 [6];
  art_iterator_t it;
  uint local_c0;
  ushort local_bc;
  art_iterator_t local_b8;
  
  local_c0 = (uint)(byte)(val >> 0x38) | (uint)((val & 0xff00000000ffff) >> 0x28) |
             (uint)(val >> 0x18) & 0xff0000 | (uint)(val >> 8) & 0xff000000;
  local_bc = (ushort)(val >> 0x18) & 0xff | (ushort)(val >> 8) & 0xff00;
  art_init_iterator(&local_b8,&r->art,true);
  uVar9 = 0;
  do {
    paVar3 = local_b8.value;
    if (local_b8.value == (art_val_t *)0x0) {
      return uVar9;
    }
    iVar6 = art_compare_keys(local_b8.key,(art_key_chunk_t *)&local_c0);
    if (iVar6 < 0) {
      prVar12 = *(run_container_t **)(paVar3[1].key + 2);
      aVar4 = paVar3[1].key[0];
      if (aVar4 == '\x04') {
        aVar4 = *(art_key_chunk_t *)&prVar12->runs;
        prVar12 = *(run_container_t **)prVar12;
      }
      if (aVar4 == '\x03') {
        iVar8 = run_container_cardinality(prVar12);
      }
      else {
        iVar8 = prVar12->n_runs;
      }
      uVar9 = uVar9 + (long)iVar8;
      art_iterator_next(&local_b8);
    }
    else {
      unaff_R13 = uVar9;
      if (iVar6 == 0) {
        prVar12 = *(run_container_t **)(paVar3[1].key + 2);
        bVar5 = paVar3[1].key[0];
        if (bVar5 == 4) {
          bVar5 = *(byte *)&prVar12->runs;
          prVar12 = *(run_container_t **)prVar12;
        }
        x = (uint16_t)(val & 0xff00000000ffff);
        if (bVar5 == 3) {
          uVar7 = run_container_rank(prVar12,x);
        }
        else if (bVar5 == 2) {
          iVar8 = prVar12->n_runs + -1;
          uVar11 = 0;
          uVar7 = (uint)bVar5;
          do {
            if (iVar8 < (int)uVar11) {
              uVar10 = ~uVar11;
              break;
            }
            uVar10 = uVar11 + iVar8 >> 1;
            uVar1 = *(ushort *)((long)&prVar12->runs->value + (ulong)(uVar11 + iVar8 & 0xfffffffe));
            if (uVar1 < (ushort)val) {
              uVar11 = uVar10 + 1;
              bVar2 = true;
              uVar10 = uVar7;
            }
            else if ((ushort)val < uVar1) {
              iVar8 = uVar10 - 1;
              bVar2 = true;
              uVar10 = uVar7;
            }
            else {
              bVar2 = false;
            }
            uVar7 = uVar10;
          } while (bVar2);
          uVar7 = ~uVar10;
          if (-1 < (int)uVar10) {
            uVar7 = uVar10 + 1;
          }
        }
        else {
          uVar7 = bitset_container_rank((bitset_container_t *)prVar12,x);
        }
        unaff_R13 = (long)(int)uVar7 + uVar9;
      }
    }
    if (-1 < iVar6) {
      return unaff_R13;
    }
  } while( true );
}

Assistant:

uint64_t roaring64_bitmap_rank(const roaring64_bitmap_t *r, uint64_t val) {
    uint8_t high48[ART_KEY_BYTES];
    uint16_t low16 = split_key(val, high48);

    art_iterator_t it = art_init_iterator(&r->art, /*first=*/true);
    uint64_t rank = 0;
    while (it.value != NULL) {
        leaf_t *leaf = (leaf_t *)it.value;
        int compare_result = compare_high48(it.key, high48);
        if (compare_result < 0) {
            rank += container_get_cardinality(leaf->container, leaf->typecode);
        } else if (compare_result == 0) {
            return rank +
                   container_rank(leaf->container, leaf->typecode, low16);
        } else {
            return rank;
        }
        art_iterator_next(&it);
    }
    return rank;
}